

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O0

int testSpanTestsStaticSizedAccessImmutable(void)

{
  int iVar1;
  initializer_list<int> __l;
  reference piVar2;
  ostream *poVar3;
  Span<int_const,18446744073709551615ul> *this;
  Span<const_int,_18446744073709551615UL> local_80;
  undefined1 local_70 [8];
  Span<const_int,_4UL> span;
  allocator<int> local_49;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  Span<int_const,18446744073709551615ul> *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  
  local_48 = 1;
  local_44 = 2;
  local_40 = 3;
  local_3c = 4;
  local_38 = (Span<int_const,18446744073709551615ul> *)&local_48;
  local_30 = 4;
  std::allocator<int>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = (iterator)local_38;
  this = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_49);
  std::allocator<int>::~allocator(&local_49);
  local_80 = MILBlob::Util::MakeSpan<int,_std::vector,_std::allocator<int>_>
                       ((vector<int,_std::allocator<int>_> *)local_28);
  local_70 = (undefined1  [8])
             MILBlob::Util::Span<int_const,18446744073709551615ul>::StaticResize<4ul>
                       ((Span<const_int,_4UL> *)&local_80,this);
  piVar2 = MILBlob::Util::Span<const_int,_4UL>::Get<0UL,_0>((Span<const_int,_4UL> *)local_70);
  iVar1 = *piVar2;
  if (iVar1 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x111);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"(span.Get<0>()) == (1)");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._5_3_ = 0;
  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_1_ = iVar1 != 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int testSpanTestsStaticSizedAccessImmutable()
{
    const std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values).StaticResize<4>();

    ML_ASSERT_EQ(span.Get<0>(), 1);

    static_assert(std::is_same<decltype(span.Get<0>()), const int&>::value, "Get<0>() should be immutable");

    return 0;
}